

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O2

bool __thiscall
tfeedback_decl::store
          (tfeedback_decl *this,gl_context *ctx,gl_shader_program *prog,
          gl_transform_feedback_info *info,uint buffer,uint buffer_index,uint max_outputs,
          uint **used_components,bool *explicit_stride,bool has_xfb_qualifiers,void *mem_ctx)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  int iVar4;
  gl_transform_feedback_output *pgVar5;
  gl_transform_feedback_varying_info *pgVar6;
  ulong uVar7;
  uint32_t uVar8;
  bool bVar9;
  uint uVar10;
  uint *puVar11;
  char *pcVar12;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint32_t local_5c;
  
  uVar15 = this->skip_components;
  if (uVar15 == 0) {
    if (this->next_buffer_separator == true) {
      uVar15 = 0;
    }
    else {
      if (has_xfb_qualifiers) {
        uVar18 = this->offset >> 2;
      }
      else {
        uVar18 = info->Buffers[buffer].Stride;
      }
      uVar15 = this->size;
      info->Varyings[info->NumVarying].Offset = uVar18 * 4;
      local_5c = this->location;
      uVar14 = this->location_frac;
      uVar10 = num_components(this);
      if ((prog->TransformFeedback).BufferMode == 0x8c8c || has_xfb_qualifiers) {
        uVar13 = (ctx->Const).MaxTransformFeedbackInterleavedComponents;
        if (uVar13 < uVar10 + uVar18) {
          linker_error(prog,
                       "The MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS limit has been exceeded.")
          ;
          return false;
        }
      }
      else {
        uVar13 = (ctx->Const).MaxTransformFeedbackInterleavedComponents;
      }
      uVar1 = (uVar10 + uVar18) - 1;
      if (uVar13 <= uVar1) {
        __assert_fail("last_component < max_components",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                      ,0x4dc,
                      "bool tfeedback_decl::store(struct gl_context *, struct gl_shader_program *, struct gl_transform_feedback_info *, unsigned int, unsigned int, const unsigned int, unsigned int **, bool *, bool, const void *) const"
                     );
      }
      puVar11 = used_components[buffer];
      if (puVar11 == (uint *)0x0) {
        puVar11 = (uint *)rzalloc_array_size(mem_ctx,4,(uint)((ulong)uVar13 + 0x1f >> 5));
        used_components[buffer] = puVar11;
      }
      uVar7 = (ulong)(uVar18 >> 5);
      uVar16 = (ulong)(uVar1 >> 5);
      for (lVar17 = 0; uVar7 + lVar17 <= uVar16; lVar17 = lVar17 + 1) {
        uVar13 = 0;
        if (uVar16 - uVar7 == lVar17) {
          uVar13 = uVar10 + uVar18 & 0x1f;
        }
        uVar13 = (-(uint)(lVar17 != 0) | -1 << ((byte)uVar18 & 0x1f)) &
                 (-(uint)(uVar13 == 0) | ~(-1 << (sbyte)uVar13));
        if ((uVar13 & puVar11[uVar7 + lVar17]) != 0) {
          linker_error(prog,"variable \'%s\', xfb_offset (%d) is causing aliasing.",this->orig_name,
                       uVar18 * 4);
          return false;
        }
        puVar11[uVar7 + lVar17] = puVar11[uVar7 + lVar17] | uVar13;
      }
      for (; uVar10 != 0; uVar10 = uVar10 - uVar8) {
        uVar8 = 4 - uVar14;
        if (uVar10 < 4 - uVar14) {
          uVar8 = uVar10;
        }
        if (max_outputs <= info->NumOutputs && (info->NumOutputs != 0 || max_outputs != 0)) {
          __assert_fail("(info->NumOutputs == 0 && max_outputs == 0) || info->NumOutputs < max_outputs"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                        ,0x4fa,
                        "bool tfeedback_decl::store(struct gl_context *, struct gl_shader_program *, struct gl_transform_feedback_info *, unsigned int, unsigned int, const unsigned int, unsigned int **, bool *, bool, const void *) const"
                       );
        }
        bVar9 = is_varying_written(this);
        uVar3 = this->stream_id;
        if (bVar9) {
          pgVar5 = info->Outputs;
          uVar13 = info->NumOutputs;
          pgVar5[uVar13].ComponentOffset = uVar14;
          pgVar5[uVar13].OutputRegister = local_5c;
          pgVar5[uVar13].NumComponents = uVar8;
          pgVar5[uVar13].StreamId = uVar3;
          pgVar5[uVar13].OutputBuffer = buffer;
          pgVar5[uVar13].DstOffset = uVar18;
          info->NumOutputs = uVar13 + 1;
        }
        info->Buffers[buffer].Stream = uVar3;
        uVar18 = uVar18 + uVar8;
        local_5c = local_5c + 1;
        uVar14 = 0;
      }
      if ((explicit_stride == (bool *)0x0) || (explicit_stride[buffer] != true)) {
        info->Buffers[buffer].Stride = uVar18;
      }
      else {
        bVar9 = is_64bit(this);
        uVar10 = info->Buffers[buffer].Stride;
        if (((byte)uVar10 & bVar9) == 1) {
          linker_error(prog,
                       "invalid qualifier xfb_stride=%d must be a multiple of 8 as its applied to a type that is or contains a double."
                       ,(ulong)(uVar10 << 2));
          return false;
        }
        if (uVar10 < uVar18) {
          linker_error(prog,"xfb_offset (%d) overflows xfb_stride (%d) for buffer (%d)",
                       (ulong)(uVar18 << 2),(ulong)(uVar10 << 2),(ulong)buffer);
          return false;
        }
      }
    }
  }
  else {
    puVar2 = &info->Buffers[buffer].Stride;
    *puVar2 = *puVar2 + uVar15;
  }
  pcVar12 = ralloc_strdup(prog,this->orig_name);
  pgVar6 = info->Varyings;
  iVar4 = info->NumVarying;
  pgVar6[iVar4].Name = pcVar12;
  pgVar6[iVar4].Type = (GLenum16)this->type;
  pgVar6[iVar4].Size = uVar15;
  pgVar6[iVar4].BufferIndex = buffer_index;
  info->NumVarying = iVar4 + 1;
  puVar2 = &info->Buffers[buffer].NumVaryings;
  *puVar2 = *puVar2 + 1;
  return true;
}

Assistant:

bool
tfeedback_decl::store(struct gl_context *ctx, struct gl_shader_program *prog,
                      struct gl_transform_feedback_info *info,
                      unsigned buffer, unsigned buffer_index,
                      const unsigned max_outputs,
                      BITSET_WORD *used_components[MAX_FEEDBACK_BUFFERS],
                      bool *explicit_stride, bool has_xfb_qualifiers,
                      const void* mem_ctx) const
{
   unsigned xfb_offset = 0;
   unsigned size = this->size;
   /* Handle gl_SkipComponents. */
   if (this->skip_components) {
      info->Buffers[buffer].Stride += this->skip_components;
      size = this->skip_components;
      goto store_varying;
   }

   if (this->next_buffer_separator) {
      size = 0;
      goto store_varying;
   }

   if (has_xfb_qualifiers) {
      xfb_offset = this->offset / 4;
   } else {
      xfb_offset = info->Buffers[buffer].Stride;
   }
   info->Varyings[info->NumVarying].Offset = xfb_offset * 4;

   {
      unsigned location = this->location;
      unsigned location_frac = this->location_frac;
      unsigned num_components = this->num_components();

      /* From GL_EXT_transform_feedback:
       *
       *   " A program will fail to link if:
       *
       *       * the total number of components to capture is greater than the
       *         constant MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS_EXT
       *         and the buffer mode is INTERLEAVED_ATTRIBS_EXT."
       *
       * From GL_ARB_enhanced_layouts:
       *
       *   " The resulting stride (implicit or explicit) must be less than or
       *     equal to the implementation-dependent constant
       *     gl_MaxTransformFeedbackInterleavedComponents."
       */
      if ((prog->TransformFeedback.BufferMode == GL_INTERLEAVED_ATTRIBS ||
           has_xfb_qualifiers) &&
          xfb_offset + num_components >
          ctx->Const.MaxTransformFeedbackInterleavedComponents) {
         linker_error(prog,
                      "The MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS "
                      "limit has been exceeded.");
         return false;
      }

      /* From the OpenGL 4.60.5 spec, section 4.4.2. Output Layout Qualifiers,
       * Page 76, (Transform Feedback Layout Qualifiers):
       *
       *   " No aliasing in output buffers is allowed: It is a compile-time or
       *     link-time error to specify variables with overlapping transform
       *     feedback offsets."
       */
      const unsigned max_components =
         ctx->Const.MaxTransformFeedbackInterleavedComponents;
      const unsigned first_component = xfb_offset;
      const unsigned last_component = xfb_offset + num_components - 1;
      const unsigned start_word = BITSET_BITWORD(first_component);
      const unsigned end_word = BITSET_BITWORD(last_component);
      BITSET_WORD *used;
      assert(last_component < max_components);

      if (!used_components[buffer]) {
         used_components[buffer] =
            rzalloc_array(mem_ctx, BITSET_WORD, BITSET_WORDS(max_components));
      }
      used = used_components[buffer];

      for (unsigned word = start_word; word <= end_word; word++) {
         unsigned start_range = 0;
         unsigned end_range = BITSET_WORDBITS - 1;

         if (word == start_word)
            start_range = first_component % BITSET_WORDBITS;

         if (word == end_word)
            end_range = last_component % BITSET_WORDBITS;

         if (used[word] & BITSET_RANGE(start_range, end_range)) {
            linker_error(prog,
                         "variable '%s', xfb_offset (%d) is causing aliasing.",
                         this->orig_name, xfb_offset * 4);
            return false;
         }
         used[word] |= BITSET_RANGE(start_range, end_range);
      }

      while (num_components > 0) {
         unsigned output_size = MIN2(num_components, 4 - location_frac);
         assert((info->NumOutputs == 0 && max_outputs == 0) ||
                info->NumOutputs < max_outputs);

         /* From the ARB_enhanced_layouts spec:
          *
          *    "If such a block member or variable is not written during a shader
          *    invocation, the buffer contents at the assigned offset will be
          *    undefined.  Even if there are no static writes to a variable or
          *    member that is assigned a transform feedback offset, the space is
          *    still allocated in the buffer and still affects the stride."
          */
         if (this->is_varying_written()) {
            info->Outputs[info->NumOutputs].ComponentOffset = location_frac;
            info->Outputs[info->NumOutputs].OutputRegister = location;
            info->Outputs[info->NumOutputs].NumComponents = output_size;
            info->Outputs[info->NumOutputs].StreamId = stream_id;
            info->Outputs[info->NumOutputs].OutputBuffer = buffer;
            info->Outputs[info->NumOutputs].DstOffset = xfb_offset;
            ++info->NumOutputs;
         }
         info->Buffers[buffer].Stream = this->stream_id;
         xfb_offset += output_size;

         num_components -= output_size;
         location++;
         location_frac = 0;
      }
   }

   if (explicit_stride && explicit_stride[buffer]) {
      if (this->is_64bit() && info->Buffers[buffer].Stride % 2) {
         linker_error(prog, "invalid qualifier xfb_stride=%d must be a "
                      "multiple of 8 as its applied to a type that is or "
                      "contains a double.",
                      info->Buffers[buffer].Stride * 4);
         return false;
      }

      if (xfb_offset > info->Buffers[buffer].Stride) {
         linker_error(prog, "xfb_offset (%d) overflows xfb_stride (%d) for "
                      "buffer (%d)", xfb_offset * 4,
                      info->Buffers[buffer].Stride * 4, buffer);
         return false;
      }
   } else {
      info->Buffers[buffer].Stride = xfb_offset;
   }

 store_varying:
   info->Varyings[info->NumVarying].Name = ralloc_strdup(prog,
                                                         this->orig_name);
   info->Varyings[info->NumVarying].Type = this->type;
   info->Varyings[info->NumVarying].Size = size;
   info->Varyings[info->NumVarying].BufferIndex = buffer_index;
   info->NumVarying++;
   info->Buffers[buffer].NumVaryings++;

   return true;
}